

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

void __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::~Tokenizer
          (Tokenizer<mecab_node_t,_mecab_path_t> *this)

{
  pointer pcVar1;
  pointer ppVar2;
  char *pcVar3;
  pointer ppDVar4;
  int in_ESI;
  
  this->_vptr_Tokenizer = (_func_int **)&PTR__Tokenizer_00140b68;
  close(this,in_ESI);
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  CharProperty::~CharProperty(&this->property_);
  ppVar2 = (this->unk_tokens_).
           super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  FreeList<mecab_dictionary_info_t>::~FreeList(&this->dictionary_info_freelist_);
  (this->unk_feature_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar3 = (this->unk_feature_).super_scoped_array<char>.ptr_;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->bos_feature_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar3 = (this->bos_feature_).super_scoped_array<char>.ptr_;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  Dictionary::~Dictionary(&this->unkdic_);
  ppDVar4 = (this->dic_).
            super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar4 != (pointer)0x0) {
    operator_delete(ppDVar4);
    return;
  }
  return;
}

Assistant:

virtual ~Tokenizer() { this->close(); }